

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O1

int mbedtls_asn1_get_int(uchar **p,uchar *end,int *val)

{
  uchar *puVar1;
  byte *pbVar2;
  int iVar3;
  size_t in_RAX;
  uint uVar4;
  size_t local_18;
  
  puVar1 = *p;
  local_18 = in_RAX;
  if (end == puVar1 || (long)end - (long)puVar1 < 0) {
    iVar3 = -0x60;
  }
  else {
    iVar3 = -0x62;
    if (*puVar1 == '\x02') {
      *p = puVar1 + 1;
      iVar3 = mbedtls_asn1_get_len(p,end,&local_18);
    }
  }
  if (((iVar3 == 0) && (iVar3 = -100, 0xfffffffffffffffb < local_18 - 5)) && (-1 < (char)**p)) {
    *val = 0;
    if (local_18 != 0) {
      uVar4 = *val;
      pbVar2 = *p;
      do {
        uVar4 = uVar4 << 8 | (uint)*pbVar2;
        *val = uVar4;
        *p = pbVar2 + 1;
        local_18 = local_18 - 1;
        pbVar2 = pbVar2 + 1;
      } while (local_18 != 0);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_get_int( unsigned char **p,
                  const unsigned char *end,
                  int *val )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_INTEGER ) ) != 0 )
        return( ret );

    if( len == 0 || len > sizeof( int ) || ( **p & 0x80 ) != 0 )
        return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    *val = 0;

    while( len-- > 0 )
    {
        *val = ( *val << 8 ) | **p;
        (*p)++;
    }

    return( 0 );
}